

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall crnlib::mip_level::set_alpha_to_luma(mip_level *this)

{
  bool bVar1;
  component_flags cVar2;
  mip_level *this_local;
  
  if (this->m_pDXTImage != (dxt_image *)0x0) {
    unpack_from_dxt(this,true);
  }
  image<crnlib::color_quad<unsigned_char,_int>_>::set_alpha_to_luma(this->m_pImage);
  cVar2 = image<crnlib::color_quad<unsigned_char,_int>_>::get_comp_flags(this->m_pImage);
  this->m_comp_flags = cVar2;
  bVar1 = image<crnlib::color_quad<unsigned_char,_int>_>::is_grayscale(this->m_pImage);
  if (bVar1) {
    this->m_format = PIXEL_FMT_A8L8;
  }
  else {
    this->m_format = PIXEL_FMT_A8R8G8B8;
  }
  return true;
}

Assistant:

bool mip_level::set_alpha_to_luma() {
  if (m_pDXTImage)
    unpack_from_dxt(true);

  m_pImage->set_alpha_to_luma();

  m_comp_flags = m_pImage->get_comp_flags();

  if (m_pImage->is_grayscale())
    m_format = PIXEL_FMT_A8L8;
  else
    m_format = PIXEL_FMT_A8R8G8B8;

  return true;
}